

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cc
# Opt level: O2

void __thiscall AVO::Simulator::doStep(Simulator *this)

{
  pointer ppAVar1;
  pointer ppAVar2;
  int agentNo;
  long lVar3;
  
  KdTree::buildAgentTree(this->kdTree_);
  lVar3 = 0;
  while( true ) {
    ppAVar1 = (this->agents_).super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppAVar2 = (this->agents_).super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppAVar2 - (long)ppAVar1) >> 3) <= lVar3) break;
    Agent::computeNeighbors(ppAVar1[lVar3],this->kdTree_);
    Agent::computeNewVelocity
              ((this->agents_).super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar3],this->timeStep_);
    lVar3 = lVar3 + 1;
  }
  for (lVar3 = 0; lVar3 < (int)((ulong)((long)ppAVar2 - (long)ppAVar1) >> 3); lVar3 = lVar3 + 1) {
    Agent::update(ppAVar1[lVar3],this->timeStep_);
    ppAVar1 = (this->agents_).super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppAVar2 = (this->agents_).super__Vector_base<AVO::Agent_*,_std::allocator<AVO::Agent_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  this->globalTime_ = this->timeStep_ + this->globalTime_;
  return;
}

Assistant:

void Simulator::doStep() {
  kdTree_->buildAgentTree();

#ifdef _OPENMP
#pragma omp parallel for
#endif  // _OPENMP
  for (int agentNo = 0; agentNo < static_cast<int>(agents_.size()); ++agentNo) {
    agents_[agentNo]->computeNeighbors(kdTree_);
    agents_[agentNo]->computeNewVelocity(timeStep_);
  }

#ifdef _OPENMP
#pragma omp parallel for
#endif  // _OPENMP
  for (int agentNo = 0; agentNo < static_cast<int>(agents_.size()); ++agentNo) {
    agents_[agentNo]->update(timeStep_);
  }

  globalTime_ += timeStep_;
}